

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O0

bool __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
::_is_negative_in_pair
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
           *this,Index columnIndex)

{
  bool bVar1;
  ID_index IVar2;
  Index columnIndex_00;
  ID_index IVar3;
  Master_chain_matrix *pMVar4;
  Column *this_00;
  Column *col;
  Index columnIndex_local;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
  *this_local;
  
  pMVar4 = _matrix(this);
  this_00 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
            ::get_column(pMVar4,columnIndex);
  bVar1 = Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
          ::is_paired(&this_00->super_Chain_column_option);
  if (bVar1) {
    IVar2 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
            ::get_pivot(this_00);
    pMVar4 = _matrix(this);
    columnIndex_00 =
         Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
         ::get_paired_chain_index(&this_00->super_Chain_column_option);
    IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
            ::get_pivot(pMVar4,columnIndex_00);
    this_local._7_1_ = IVar3 < IVar2;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Chain_vine_swap<Master_matrix>::_is_negative_in_pair(Index columnIndex)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    return CP::is_negative_in_pair(_matrix()->get_pivot(columnIndex));
  } else {
    auto& col = _matrix()->get_column(columnIndex);
    if (!col.is_paired()) return false;
    return col.get_pivot() > _matrix()->get_pivot(col.get_paired_chain_index());
  }
}